

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O0

int main(void)

{
  int iVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLint GVar5;
  GLFWcursor *pGVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  float local_2b8;
  int i_1;
  mat4x4 mvp;
  vec2 vertices [4];
  GLsizei local_248;
  float scale;
  int fb_height;
  int fb_width;
  int wnd_height;
  int wnd_width;
  int shapes [6];
  GLint vpos_location;
  GLint mvp_location;
  GLuint program;
  GLuint fragment_shader;
  GLuint vertex_shader;
  GLuint vertex_buffer;
  GLFWcursor *current_frame;
  GLFWcursor *star_cursors [60];
  GLFWwindow *window;
  int i;
  
  _vertex_shader = (GLFWcursor *)0x0;
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  tracking_cursor = create_tracking_cursor();
  if (tracking_cursor != (GLFWcursor *)0x0) {
    window._0_4_ = 0;
    while( true ) {
      if (0x3b < (int)(uint)window) {
        window._0_4_ = 0;
        while( true ) {
          if (5 < (uint)window) {
            glfwWindowHint(0x22002,2);
            glfwWindowHint(0x22003,0);
            star_cursors[0x3b] =
                 (GLFWcursor *)
                 glfwCreateWindow(0x280,0x1e0,"Cursor Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
            if (star_cursors[0x3b] != (GLFWcursor *)0x0) {
              glfwMakeContextCurrent((GLFWwindow *)star_cursors[0x3b]);
              gladLoadGL(glfwGetProcAddress);
              (*glad_glGenBuffers)(1,&fragment_shader);
              (*glad_glBindBuffer)(0x8892,fragment_shader);
              GVar2 = (*glad_glCreateShader)(0x8b31);
              (*glad_glShaderSource)(GVar2,1,&vertex_shader_text,(GLint *)0x0);
              (*glad_glCompileShader)(GVar2);
              GVar3 = (*glad_glCreateShader)(0x8b30);
              (*glad_glShaderSource)(GVar3,1,&fragment_shader_text,(GLint *)0x0);
              (*glad_glCompileShader)(GVar3);
              GVar4 = (*glad_glCreateProgram)();
              (*glad_glAttachShader)(GVar4,GVar2);
              (*glad_glAttachShader)(GVar4,GVar3);
              (*glad_glLinkProgram)(GVar4);
              GVar5 = (*glad_glGetUniformLocation)(GVar4,"MVP");
              GVar2 = (*glad_glGetAttribLocation)(GVar4,"vPos");
              (*glad_glEnableVertexAttribArray)(GVar2);
              (*glad_glVertexAttribPointer)(GVar2,2,0x1406,'\0',8,(void *)0x0);
              (*glad_glUseProgram)(GVar4);
              glfwGetCursorPos((GLFWwindow *)star_cursors[0x3b],&cursor_x,&cursor_y);
              printf("Cursor position: %f %f\n",cursor_x,cursor_y);
              glfwSetCursorPosCallback((GLFWwindow *)star_cursors[0x3b],cursor_position_callback);
              glfwSetKeyCallback((GLFWwindow *)star_cursors[0x3b],key_callback);
              while (iVar1 = glfwWindowShouldClose((GLFWwindow *)star_cursors[0x3b]), iVar1 == 0) {
                (*glad_glClear)(0x4000);
                if (track_cursor != 0) {
                  glfwGetWindowSize((GLFWwindow *)star_cursors[0x3b],&fb_width,&fb_height);
                  glfwGetFramebufferSize((GLFWwindow *)star_cursors[0x3b],(int *)&scale,&local_248);
                  (*glad_glViewport)(0,0,(GLsizei)scale,local_248);
                  fVar7 = (float)(int)scale / (float)fb_width;
                  mvp[3][2] = 0.5;
                  dVar8 = (double)local_248;
                  dVar9 = floor(cursor_y * (double)fVar7);
                  mvp[3][3] = (float)(((dVar8 - dVar9) - 1.0) + 0.5);
                  floor(cursor_y * (double)fVar7);
                  floor(cursor_x * (double)fVar7);
                  floor(cursor_x * (double)fVar7);
                  (*glad_glBufferData)(0x8892,0x20,mvp[3] + 2,0x88e0);
                  mat4x4_ortho((vec4 *)&local_2b8,0.0,(float)(int)scale,0.0,(float)local_248,0.0,1.0
                              );
                  (*glad_glUniformMatrix4fv)(GVar5,1,'\0',&local_2b8);
                  (*glad_glDrawArrays)(1,0,4);
                }
                glfwSwapBuffers((GLFWwindow *)star_cursors[0x3b]);
                if (animate_cursor == 0) {
                  _vertex_shader = (GLFWcursor *)0x0;
                }
                else {
                  dVar8 = glfwGetTime();
                  iVar1 = (int)(dVar8 * 30.0) % 0x3c;
                  if (_vertex_shader != star_cursors[(long)iVar1 + -1]) {
                    glfwSetCursor((GLFWwindow *)star_cursors[0x3b],star_cursors[(long)iVar1 + -1]);
                    _vertex_shader = star_cursors[(long)iVar1 + -1];
                  }
                }
                if (wait_events == 0) {
                  glfwPollEvents();
                }
                else if (animate_cursor == 0) {
                  glfwWaitEvents();
                }
                else {
                  glfwWaitEventsTimeout(0.03333333333333333);
                }
                fflush(_stdout);
              }
              glfwDestroyWindow((GLFWwindow *)star_cursors[0x3b]);
              for (window._0_4_ = 0; (int)(uint)window < 0x3c; window._0_4_ = (uint)window + 1) {
                glfwDestroyCursor(star_cursors[(long)(int)(uint)window + -1]);
              }
              for (window._0_4_ = 0; (uint)window < 6; window._0_4_ = (uint)window + 1) {
                glfwDestroyCursor(standard_cursors[(int)(uint)window]);
              }
              glfwTerminate();
              exit(0);
            }
            glfwTerminate();
            exit(1);
          }
          _wnd_height = 0x3600200036001;
          shapes[0] = 0x36003;
          shapes[1] = 0x36004;
          shapes[2] = 0x36005;
          shapes[3] = 0x36006;
          pGVar6 = glfwCreateStandardCursor((&wnd_height)[(int)(uint)window]);
          standard_cursors[(int)(uint)window] = pGVar6;
          if (standard_cursors[(int)(uint)window] == (GLFWcursor *)0x0) break;
          window._0_4_ = (uint)window + 1;
        }
        glfwTerminate();
        exit(1);
      }
      pGVar6 = create_cursor_frame((float)(int)(uint)window / 60.0);
      star_cursors[(long)(int)(uint)window + -1] = pGVar6;
      if (star_cursors[(long)(int)(uint)window + -1] == (GLFWcursor *)0x0) break;
      window._0_4_ = (uint)window + 1;
    }
    glfwTerminate();
    exit(1);
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(void)
{
    int i;
    GLFWwindow* window;
    GLFWcursor* star_cursors[CURSOR_FRAME_COUNT];
    GLFWcursor* current_frame = NULL;
    GLuint vertex_buffer, vertex_shader, fragment_shader, program;
    GLint mvp_location, vpos_location;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    tracking_cursor = create_tracking_cursor();
    if (!tracking_cursor)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    for (i = 0;  i < CURSOR_FRAME_COUNT;  i++)
    {
        star_cursors[i] = create_cursor_frame(i / (float) CURSOR_FRAME_COUNT);
        if (!star_cursors[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }
    }

    for (i = 0;  i < sizeof(standard_cursors) / sizeof(standard_cursors[0]);  i++)
    {
        const int shapes[] = {
            GLFW_ARROW_CURSOR,
            GLFW_IBEAM_CURSOR,
            GLFW_CROSSHAIR_CURSOR,
            GLFW_HAND_CURSOR,
            GLFW_HRESIZE_CURSOR,
            GLFW_VRESIZE_CURSOR
        };

        standard_cursors[i] = glfwCreateStandardCursor(shapes[i]);
        if (!standard_cursors[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    window = glfwCreateWindow(640, 480, "Cursor Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    mvp_location = glGetUniformLocation(program, "MVP");
    vpos_location = glGetAttribLocation(program, "vPos");

    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vec2), (void*) 0);
    glUseProgram(program);

    glfwGetCursorPos(window, &cursor_x, &cursor_y);
    printf("Cursor position: %f %f\n", cursor_x, cursor_y);

    glfwSetCursorPosCallback(window, cursor_position_callback);
    glfwSetKeyCallback(window, key_callback);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);

        if (track_cursor)
        {
            int wnd_width, wnd_height, fb_width, fb_height;
            float scale;
            vec2 vertices[4];
            mat4x4 mvp;

            glfwGetWindowSize(window, &wnd_width, &wnd_height);
            glfwGetFramebufferSize(window, &fb_width, &fb_height);

            glViewport(0, 0, fb_width, fb_height);

            scale = (float) fb_width / (float) wnd_width;
            vertices[0][0] = 0.5f;
            vertices[0][1] = (float) (fb_height - floor(cursor_y * scale) - 1.f + 0.5f);
            vertices[1][0] = (float) fb_width + 0.5f;
            vertices[1][1] = (float) (fb_height - floor(cursor_y * scale) - 1.f + 0.5f);
            vertices[2][0] = (float) floor(cursor_x * scale) + 0.5f;
            vertices[2][1] = 0.5f;
            vertices[3][0] = (float) floor(cursor_x * scale) + 0.5f;
            vertices[3][1] = (float) fb_height + 0.5f;

            glBufferData(GL_ARRAY_BUFFER,
                         sizeof(vertices),
                         vertices,
                         GL_STREAM_DRAW);

            mat4x4_ortho(mvp, 0.f, (float) fb_width, 0.f, (float) fb_height, 0.f, 1.f);
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);

            glDrawArrays(GL_LINES, 0, 4);
        }

        glfwSwapBuffers(window);

        if (animate_cursor)
        {
            const int i = (int) (glfwGetTime() * 30.0) % CURSOR_FRAME_COUNT;
            if (current_frame != star_cursors[i])
            {
                glfwSetCursor(window, star_cursors[i]);
                current_frame = star_cursors[i];
            }
        }
        else
            current_frame = NULL;

        if (wait_events)
        {
            if (animate_cursor)
                glfwWaitEventsTimeout(1.0 / 30.0);
            else
                glfwWaitEvents();
        }
        else
            glfwPollEvents();

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwDestroyWindow(window);

    for (i = 0;  i < CURSOR_FRAME_COUNT;  i++)
        glfwDestroyCursor(star_cursors[i]);

    for (i = 0;  i < sizeof(standard_cursors) / sizeof(standard_cursors[0]);  i++)
        glfwDestroyCursor(standard_cursors[i]);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}